

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

void __thiscall BaseIndex::SetBestBlockIndex(BaseIndex *this,CBlockIndex *block)

{
  bool bVar1;
  ulong uVar2;
  long in_RSI;
  __pointer_type in_RDI;
  long in_FS_OFFSET;
  PruneLockInfo prune_lock;
  BlockManager *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc8;
  byte bVar3;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = ::node::BlockManager::IsPruneMode(in_stack_ffffffffffffffb8);
  bVar3 = 1;
  if (bVar1) {
    bVar3 = (**(code **)(in_RDI->phashBlock[2].super_base_blob<256U>.m_data._M_elems + 0x10))();
  }
  if ((bVar3 & 1) == 0) {
    __assert_fail("!m_chainstate->m_blockman.IsPruneMode() || AllowPrune()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/base.cpp"
                  ,0x1b6,"void BaseIndex::SetBestBlockIndex(const CBlockIndex *)");
  }
  uVar2 = (**(code **)(in_RDI->phashBlock[2].super_base_blob<256U>.m_data._M_elems + 0x10))();
  if (((uVar2 & 1) != 0) && (in_RSI != 0)) {
    ::node::PruneLockInfo::PruneLockInfo((PruneLockInfo *)in_stack_ffffffffffffffb8);
    local_c = *(undefined4 *)(in_RSI + 0x18);
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              (&in_stack_ffffffffffffffb8->cs_LastBlockFile);
    SetBestBlockIndex::anon_class_16_2_50ebc51b::operator()
              ((anon_class_16_2_50ebc51b *)&stack0xfffffffffffffff4);
  }
  std::atomic<const_CBlockIndex_*>::operator=
            ((atomic<const_CBlockIndex_*> *)CONCAT17(bVar3,in_stack_ffffffffffffffc8),in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void BaseIndex::SetBestBlockIndex(const CBlockIndex* block)
{
    assert(!m_chainstate->m_blockman.IsPruneMode() || AllowPrune());

    if (AllowPrune() && block) {
        node::PruneLockInfo prune_lock;
        prune_lock.height_first = block->nHeight;
        WITH_LOCK(::cs_main, m_chainstate->m_blockman.UpdatePruneLock(GetName(), prune_lock));
    }

    // Intentionally set m_best_block_index as the last step in this function,
    // after updating prune locks above, and after making any other references
    // to *this, so the BlockUntilSyncedToCurrentChain function (which checks
    // m_best_block_index as an optimization) can be used to wait for the last
    // BlockConnected notification and safely assume that prune locks are
    // updated and that the index object is safe to delete.
    m_best_block_index = block;
}